

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O2

void __thiscall
persistence_computer_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::
assemble_columns_to_reduce
          (persistence_computer_t<directed_flag_complex_computer::directed_flag_complex_computer_t>
           *this,index_t dimension,pivot_column_index_t *pivot_column_index)

{
  uint uVar1;
  ostream *poVar2;
  reference piVar3;
  deque<filtration_index_t,_std::allocator<filtration_index_t>_> *this_00;
  ulong uVar4;
  ulong __n;
  value_t vVar5;
  pair<float,_int> local_38;
  
  uVar1 = (uint)(this->complex->cell_count).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[(long)dimension + 1];
  this_00 = &this->columns_to_reduce;
  std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::clear(this_00);
  poVar2 = std::operator<<((ostream *)&std::cout,"\x1b[K");
  poVar2 = std::operator<<(poVar2,"assembling ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  std::operator<<(poVar2," columns");
  poVar2 = (ostream *)std::ostream::flush();
  std::operator<<(poVar2,"\r");
  __n = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  while (__n != uVar4) {
    piVar3 = std::_Deque_iterator<int,_int_&,_int_*>::operator[]
                       (&(pivot_column_index->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
                         super__Deque_impl_data._M_start,__n);
    if (*piVar3 == 0x7fffffff) {
      vVar5 = directed_flag_complex_computer::directed_flag_complex_computer_t::filtration
                        (this->complex,dimension + 1,(index_t)__n);
      if (vVar5 <= this->max_filtration) {
        local_38 = (pair<float,_int>)((ulong)(uint)vVar5 | __n << 0x20);
        std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::
        emplace_back<filtration_index_t>(this_00,(filtration_index_t *)&local_38);
      }
      __n = __n + 1;
      if ((int)((__n & 0xffffffff) % 100000) == 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"\x1b[K");
        poVar2 = std::operator<<(poVar2,"assembled ");
        std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::size(this_00);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        poVar2 = std::operator<<(poVar2," out of ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)__n);
        poVar2 = std::operator<<(poVar2,"/");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
        std::operator<<(poVar2," columns");
        poVar2 = (ostream *)std::ostream::flush();
        std::operator<<(poVar2,"\r");
      }
    }
    else {
      __n = __n + 1;
    }
  }
  std::operator<<((ostream *)&std::cout,"\x1b[K");
  return;
}

Assistant:

void assemble_columns_to_reduce(index_t dimension, pivot_column_index_t& pivot_column_index) {
		index_t num_cells = index_t(complex.number_of_cells(dimension + 1));

		columns_to_reduce.clear();

#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "assembling " << num_cells << " columns" << std::flush << "\r";
#endif

		for (index_t index = 0; index < num_cells; ++index) {
			if (
#ifdef USE_ARRAY_HASHMAP
			    pivot_column_index[index] == INVALID_INDEX
#else
			    pivot_column_index.find(index) == pivot_column_index.end()
#endif
			) {
				value_t filtration = complex.filtration(dimension + 1, index);
				if (filtration <= max_filtration) { columns_to_reduce.push_back(std::make_pair(filtration, index)); }
#ifdef INDICATE_PROGRESS
				if ((index + 1) % 100000 == 0)
					std::cout << "\033[K"
					          << "assembled " << columns_to_reduce.size() << " out of " << (index + 1) << "/"
					          << num_cells << " columns" << std::flush << "\r";
#endif
			}
		}
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K";
#endif
	}